

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_handle_button_press(natwm_state *state,xcb_button_press_event_t *event)

{
  uint16_t uVar1;
  workspace *workspace_00;
  monitor *pmVar2;
  client *client_00;
  client *client;
  monitor *monitor;
  workspace *workspace;
  xcb_button_press_event_t *event_local;
  natwm_state *state_local;
  
  workspace_00 = workspace_list_find_window_workspace(state->workspace_list,event->event);
  if (workspace_00 == (workspace *)0x0) {
    state_local._4_4_ = NO_ERROR;
  }
  else {
    pmVar2 = monitor_list_get_workspace_monitor(state->monitor_list,workspace_00);
    if (pmVar2 == (monitor *)0x0) {
      state_local._4_4_ = RESOLUTION_FAILURE;
    }
    else {
      client_00 = workspace_find_window_client(workspace_00,event->event);
      if (client_00 == (client *)0x0) {
        state_local._4_4_ = RESOLUTION_FAILURE;
      }
      else {
        uVar1 = toggle_modifiers_get_clean_mask(state->button_state->modifiers,event->state);
        if (uVar1 == 0) {
          state_local._4_4_ = button_handle_focus(state,workspace_00,client_00);
        }
        else if (uVar1 == 8) {
          state_local._4_4_ = button_handle_grab(state,event,&pmVar2->rect,client_00);
        }
        else {
          state_local._4_4_ = NO_ERROR;
        }
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error client_handle_button_press(struct natwm_state *state,
                                            xcb_button_press_event_t *event)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, event->event);

        if (workspace == NULL) {
                // Not registered with us - just pass it along
                return NO_ERROR;
        }

        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                return RESOLUTION_FAILURE;
        }

        struct client *client = workspace_find_window_client(workspace, event->event);

        if (client == NULL) {
                return RESOLUTION_FAILURE;
        }

        switch (toggle_modifiers_get_clean_mask(state->button_state->modifiers, event->state)) {
        case XCB_NONE:
                return button_handle_focus(state, workspace, client);
        case XCB_MOD_MASK_1:
                return button_handle_grab(state, event, &monitor->rect, client);
        default:
                return NO_ERROR;
        }
}